

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O0

void __thiscall DeviceGroup::~DeviceGroup(DeviceGroup *this)

{
  DeviceGroup *this_local;
  
  ~DeviceGroup(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

Q_OBJECT

public:

    explicit DeviceGroup(QString const& title) :
        QGroupBox(title)
    {
        auto layout = new QGridLayout;

        // row 0
        layout->addWidget(new QLabel(tr("API")), 0, 0);
        mApiCombo = new QComboBox;
        layout->addWidget(mApiCombo, 0, 1);

        // row 1
        layout->addWidget(new QLabel(tr("Device")), 1, 0);
        mDeviceCombo = new QComboBox;
        layout->addWidget(mDeviceCombo, 1, 1);

        // row 2
        auto rescanLayout = new QHBoxLayout;
        mErrorLabel = new QLabel(tr("API Unavailable"));
        rescanLayout->addStretch();
        rescanLayout->addWidget(mErrorLabel);
        rescanLayout->addStretch(1);
        mRescanButton = new QPushButton(tr("Rescan"));
        rescanLayout->addWidget(mRescanButton);
        layout->addLayout(rescanLayout, 2, 1);

        setLayout(layout);

        //mDeviceCombo->setMaximumWidth(300); // device names can get pretty long sometimes

    }